

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_153ab3::Db::parseUnscopedName(Db *this,NameState *State)

{
  bool bVar1;
  bool local_49;
  Node *local_48;
  Node *R;
  StringView local_30;
  NameState *local_20;
  NameState *State_local;
  Db *this_local;
  
  local_20 = State;
  State_local = (NameState *)this;
  StringView::StringView(&local_30,"StL");
  bVar1 = consumeIf(this,local_30);
  local_49 = true;
  if (!bVar1) {
    StringView::StringView((StringView *)&R,"St");
    local_49 = consumeIf(this,_R);
  }
  if (local_49 == false) {
    this_local = (Db *)parseUnqualifiedName(this,local_20);
  }
  else {
    local_48 = parseUnqualifiedName(this,local_20);
    if (local_48 == (Node *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::StdQualifiedName,(anonymous_namespace)::Node*&>
                                   ((Db *)this,&local_48);
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseUnscopedName(NameState *State) {
 if (consumeIf("StL") || consumeIf("St")) {
   Node *R = parseUnqualifiedName(State);
   if (R == nullptr)
     return nullptr;
   return make<StdQualifiedName>(R);
 }
 return parseUnqualifiedName(State);
}